

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_device_memory.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 uVar1;
  exception *e;
  TutorialBenchmark *in_stack_fffffffffffffb90;
  undefined7 in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbc4;
  TutorialApplication *in_stack_fffffffffffffbc8;
  char **in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbe0;
  Tutorial *in_stack_fffffffffffffbe8;
  string *in_stack_fffffffffffffca8;
  char **in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcbc;
  TutorialBenchmark *in_stack_fffffffffffffcc0;
  BenchFunc in_stack_fffffffffffffed8;
  TutorialBenchmark *in_stack_fffffffffffffee0;
  allocator local_109;
  string local_108 [260];
  int local_4;
  
  local_4 = 0;
  uVar1 = embree::TutorialBenchmark::benchmark(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  if ((bool)uVar1) {
    embree::TutorialBenchmark::TutorialBenchmark
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"host_device_memory",&local_109);
    local_4 = embree::TutorialBenchmark::main
                        (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,
                         in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    embree::TutorialBenchmark::~TutorialBenchmark(in_stack_fffffffffffffb90);
  }
  else {
    embree::Tutorial::Tutorial(in_stack_fffffffffffffbe8);
    local_4 = embree::TutorialApplication::main
                        (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc4,
                         (char **)CONCAT17(uVar1,in_stack_fffffffffffffbb8));
    embree::Tutorial::~Tutorial((Tutorial *)0x11bc6a);
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  try {
    if (embree::TutorialBenchmark::benchmark(argc, argv)) {
      return embree::TutorialBenchmark(embree::renderBenchFunc<embree::Tutorial>).main(argc, argv, "host_device_memory");
    }
    return embree::Tutorial().main(argc,argv);
  } catch (std::exception& e ) {
    std::cerr << "Exception caught: " << e.what() << std::endl;
  }
}